

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

shared_ptr<wasm::GCData> __thiscall wasm::Literal::getGCData(Literal *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  bool bVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  Literal *in_RSI;
  shared_ptr<wasm::GCData> sVar4;
  
  bVar2 = isNull(in_RSI);
  _Var3._M_pi = extraout_RDX;
  if (!bVar2) {
    bVar2 = wasm::Type::isData(&in_RSI->type);
    _Var3._M_pi = extraout_RDX_00;
    if (!bVar2) {
      __assert_fail("isNull() || isData()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                    ,0x143,"std::shared_ptr<GCData> wasm::Literal::getGCData() const");
    }
  }
  (this->field_0).i64 = (in_RSI->field_0).i64;
  p_Var1 = (in_RSI->field_0).gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->field_0).gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  sVar4.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi
  ;
  sVar4.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<wasm::GCData>)
         sVar4.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<GCData> Literal::getGCData() const {
  assert(isNull() || isData());
  return gcData;
}